

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::ExecuteCommand
          (cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *deferId)

{
  pointer puVar1;
  _Alloc_hider _Var2;
  pointer ppcVar3;
  element_type *peVar4;
  pointer pcVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  cmValue cVar9;
  long *plVar10;
  ostream *poVar11;
  size_type *psVar12;
  undefined4 uVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  int d;
  string error_1;
  cmMakefileCall stack_manager;
  istringstream s;
  _Any_data local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  string local_230;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_210;
  bool local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  cmMakefileCall local_1c8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined8 local_190;
  char *local_188;
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  puVar1 = (this->FunctionBlockers).c.
           super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->FunctionBlockers).c.
       super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start != puVar1) &&
     (bVar6 = cmFunctionBlocker::IsFunctionBlocked
                        (puVar1[-1]._M_t.
                         super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                         .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl,lff,status)
     , bVar6)) {
    return true;
  }
  if ((this->ExecuteCommandCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->ExecuteCommandCallback)._M_invoker)((_Any_data *)&this->ExecuteCommandCallback);
  }
  local_1f0 = false;
  if ((deferId->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_210._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_210._M_value + 0x10);
    _Var2._M_p = (deferId->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    plVar10 = (long *)((long)&(deferId->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x10);
    if ((long *)_Var2._M_p == plVar10) {
      local_210._16_8_ = *plVar10;
      local_210._24_8_ =
           *(undefined8 *)
            ((long)&(deferId->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload + 0x18);
    }
    else {
      local_210._16_8_ = *plVar10;
      local_210._M_value._M_dataplus._M_p = (_Alloc_hider)_Var2._M_p;
    }
    local_210._M_value._M_string_length =
         (deferId->
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         )._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    *(long **)&(deferId->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload = plVar10;
    (deferId->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = 0;
    *(undefined1 *)
     ((long)&(deferId->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload + 0x10) = 0;
    local_1f0 = true;
  }
  cmMakefileCall::cmMakefileCall
            (&local_1c8,this,lff,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_210,status);
  if ((local_1f0 == true) &&
     (local_1f0 = false,
     local_210._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_210._M_value + 0x10))) {
    operator_delete((void *)local_210._M_value._M_dataplus._M_p,local_210._16_8_ + 1);
  }
  local_1b0._0_8_ = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"CMAKE_MAXIMUM_RECURSION_DEPTH","");
  cVar9 = GetDefinition(this,(string *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if (cVar9.Value == (string *)0x0) {
    uVar13 = 1000;
  }
  else {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)cVar9.Value,_S_in);
    plVar10 = (long *)std::istream::operator>>(local_1b0,(int *)local_250._M_pod_data);
    uVar13 = 1000;
    if ((*(byte *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) & 5) == 0) {
      uVar13 = local_250._0_4_;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
  }
  if ((int)uVar13 < this->RecursionDepth) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,"Maximum recursion depth of ",0x1b);
    poVar11 = (ostream *)std::ostream::operator<<(local_1b0,uVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," exceeded",9);
    std::__cxx11::stringbuf::str();
    ppcVar3 = (this->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppcVar3) {
      ppcVar3[-1]->NestedError = true;
    }
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)&local_250,
                        &this->Backtrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_250._4_4_,local_250._0_4_) != &local_240) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_250._4_4_,local_250._0_4_),
                      (ulong)(local_240._M_allocated_capacity + 1));
    }
    cmSystemTools::s_FatalErrorOccurred = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
    std::ios_base::~ios_base(local_140);
    bVar6 = false;
    goto LAB_003f0ec8;
  }
  cmState::GetCommandByExactName
            ((Command *)&local_250,
             (this->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,
             &((lff->Impl).
               super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->LowerCaseName);
  bVar6 = true;
  if ((code *)local_240._M_allocated_capacity == (code *)0x0) {
    if ((cmSystemTools::s_FatalErrorOccurred == false) &&
       (bVar7 = cmSystemTools::GetInterruptFlag(), !bVar7)) {
      peVar4 = (lff->Impl).
               super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_1a0._8_8_ = (peVar4->OriginalName)._M_dataplus._M_p;
      local_1a0._M_allocated_capacity = (peVar4->OriginalName)._M_string_length;
      local_1b0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x17;
      local_1b0._8_8_ = "Unknown CMake command \"";
      local_190 = 2;
      local_188 = "\".";
      views._M_len = 3;
      views._M_array = (iterator)local_1b0;
      cmCatViews_abi_cxx11_(&local_230,views);
      ppcVar3 = (this->ExecutionStatusStack).
                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((this->ExecutionStatusStack).
          super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
          super__Vector_impl_data._M_start != ppcVar3) {
        ppcVar3[-1]->NestedError = true;
      }
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_230,
                          &this->Backtrace);
      cmSystemTools::s_FatalErrorOccurred = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
LAB_003f0ead:
      bVar6 = false;
    }
  }
  else if ((cmSystemTools::s_FatalErrorOccurred == false) &&
          (bVar7 = cmSystemTools::GetInterruptFlag(), !bVar7)) {
    if (this->GlobalGenerator->CMakeInstance->Trace == true) {
      PrintCommandTrace(this,lff,&this->Backtrace,No);
    }
    if ((code *)local_240._M_allocated_capacity == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    bVar8 = (*(code *)local_240._8_8_)
                      (&local_250,
                       &((lff->Impl).
                         super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->Arguments,status);
    if ((byte)(bVar8 ^ 1 | status->NestedError) == 1) {
      if (status->NestedError == false) {
        peVar4 = (lff->Impl).
                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        pcVar5 = (peVar4->OriginalName)._M_dataplus._M_p;
        local_1e8[0] = local_1d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1e8,pcVar5,pcVar5 + (peVar4->OriginalName)._M_string_length);
        plVar10 = (long *)std::__cxx11::string::append((char *)local_1e8);
        psVar12 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_230.field_2._M_allocated_capacity = *psVar12;
          local_230.field_2._8_8_ = plVar10[3];
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        }
        else {
          local_230.field_2._M_allocated_capacity = *psVar12;
          local_230._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_230._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0,&local_230,&status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        IssueMessage(this,FATAL_ERROR,(string *)local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._0_8_ != &local_1a0) {
          operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
        }
      }
      if (this->GlobalGenerator->CMakeInstance->CurrentWorkingMode != NORMAL_MODE) {
        cmSystemTools::s_FatalErrorOccurred = true;
      }
      goto LAB_003f0ead;
    }
  }
  if ((code *)local_240._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_240._M_allocated_capacity)(&local_250,&local_250,3);
  }
LAB_003f0ec8:
  cmMakefileCall::~cmMakefileCall(&local_1c8);
  return bVar6;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus& status,
                                cm::optional<std::string> deferId)
{
  bool result = true;

  // quick return if blocked
  if (this->IsFunctionBlocked(lff, status)) {
    // No error.
    return result;
  }

  if (this->ExecuteCommandCallback) {
    this->ExecuteCommandCallback();
  }

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, std::move(deferId), status);
  static_cast<void>(stack_manager);

  // Check for maximum recursion depth.
  int depth = CMake_DEFAULT_RECURSION_LIMIT;
  cmValue depthStr = this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (depthStr) {
    std::istringstream s(*depthStr);
    int d;
    if (s >> d) {
      depth = d;
    }
  }
  if (this->RecursionDepth > depth) {
    std::ostringstream e;
    e << "Maximum recursion depth of " << depth << " exceeded";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // Lookup the command prototype.
  if (cmState::Command command =
        this->GetState()->GetCommandByExactName(lff.LowerCaseName())) {
    // Decide whether to invoke the command.
    if (!cmSystemTools::GetFatalErrorOccurred()) {
      // if trace is enabled, print out invoke information
      if (this->GetCMakeInstance()->GetTrace()) {
        this->PrintCommandTrace(lff, this->Backtrace);
      }
      // Try invoking the command.
      bool invokeSucceeded = command(lff.Arguments(), status);
      bool hadNestedError = status.GetNestedError();
      if (!invokeSucceeded || hadNestedError) {
        if (!hadNestedError) {
          // The command invocation requested that we report an error.
          std::string const error =
            std::string(lff.OriginalName()) + " " + status.GetError();
          this->IssueMessage(MessageType::FATAL_ERROR, error);
        }
        result = false;
        if (this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE) {
          cmSystemTools::SetFatalErrorOccurred();
        }
      }
    }
  } else {
    if (!cmSystemTools::GetFatalErrorOccurred()) {
      std::string error =
        cmStrCat("Unknown CMake command \"", lff.OriginalName(), "\".");
      this->IssueMessage(MessageType::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccurred();
    }
  }

  return result;
}